

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::imageFormatProperties
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format,VkImageType imageType
          ,VkImageTiling tiling)

{
  ostringstream *poVar1;
  VkBool32 VVar2;
  ulong uVar3;
  ChannelOrder CVar4;
  deUint32 dVar5;
  VkSampleCountFlags VVar6;
  VkDeviceSize VVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  TextureChannelClass TVar12;
  qpTestResult qVar13;
  InstanceInterface *pIVar14;
  VkPhysicalDevice pVVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  MessageBuilder *pMVar17;
  TextureFormat TVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  bool bVar24;
  VkFormatProperties VVar25;
  VkImageFormatProperties properties;
  undefined1 local_2a8 [40];
  ulong local_280;
  VkPhysicalDeviceFeatures *local_278;
  TestLog *local_270;
  uint local_268;
  uint local_264;
  uint local_260;
  uint local_25c;
  uint local_258;
  VkResult queryResult;
  ResultCollector results;
  Enum<vk::VkImageTiling,_4UL> local_1e8;
  Enum<vk::VkImageType,_4UL> local_1d8;
  MessageBuilder local_1c8;
  Bitfield<32UL> local_48;
  
  local_270 = context->m_testCtx->m_log;
  local_278 = Context::getDeviceFeatures(context);
  local_2a8._32_8_ = Context::getDeviceProperties(context);
  pIVar14 = Context::getInstanceInterface(context);
  pVVar15 = Context::getPhysicalDevice(context);
  VVar25 = ::vk::getPhysicalDeviceFormatProperties(pIVar14,pVVar15,format);
  pvVar16 = Context::getDeviceExtensions_abi_cxx11_(context);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"VK_KHR_maintenance1",(allocator<char> *)local_2a8);
  results.m_log =
       (TestLog *)
       (pvVar16->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  properties.maxExtent._0_8_ =
       (pvVar16->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = de::
          contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&results,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&properties,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8
                    );
  std::__cxx11::string::~string((string *)&local_1c8);
  uVar22 = VVar25._0_8_ >> 0x20;
  uVar3 = uVar22;
  if (tiling == VK_IMAGE_TILING_LINEAR) {
    uVar3 = VVar25._0_8_;
  }
  uVar23 = (uint)uVar3;
  uVar21 = (uint)((uVar3 & 0xffffffff) >> 0xe) & 3;
  if (!bVar9) {
    uVar21 = (uint)(uVar23 != 0) * 3;
  }
  uVar19 = uVar21 + 0xd0;
  if (-1 < (char)(uVar3 & 0xffffffff)) {
    uVar19 = uVar21;
  }
  uVar19 = uVar19 + (uVar23 * 4 & 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"ERROR: ",(allocator<char> *)&properties);
  tcu::ResultCollector::ResultCollector(&results,local_270,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (bVar9 && (uVar3 & 1) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,
               "A sampled image format must have VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR and VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR format feature flags set"
               ,(allocator<char> *)&properties);
    tcu::ResultCollector::check(&results,(uVar3 & 0xc000) != 0,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  uVar21 = uVar23 >> 4 & 0x20;
  uVar23 = uVar23 * 4 & 8;
  local_264 = ~(uVar23 + uVar21 | uVar19);
  local_268 = (uint)(imageType == VK_IMAGE_TYPE_2D) << 4 | 8;
  local_260 = uVar23 + (uVar21 | uVar19) + 1;
  uVar21 = 0;
  do {
    if (uVar21 == local_260) {
      qVar13 = tcu::ResultCollector::getResult(&results);
      std::__cxx11::string::string((string *)&local_1c8,(string *)&results.m_message);
      __return_storage_ptr__->m_code = qVar13;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->m_description,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      tcu::ResultCollector::~ResultCollector(&results);
      return __return_storage_ptr__;
    }
    if ((local_264 & uVar21) == 0) {
      if ((uVar21 & 0x40) == 0) {
        if (uVar21 != 0) {
LAB_004a201f:
          local_258 = (int)(uVar21 << 0x1d) >> 0x1f & local_268;
          if ((uVar21 & 0xc) != 0 && (char)((uVar21 & 0x40) >> 6) == '\0') {
            uVar23 = local_258 | 3;
            if (local_278->sparseBinding == 0) {
              uVar23 = local_258;
            }
            local_258 = uVar23 | 4;
            if (local_278->sparseResidencyAliased == 0) {
              local_258 = uVar23;
            }
          }
          local_25c = ~local_258;
          local_258 = local_258 + 1;
          for (uVar23 = 0; local_258 != uVar23; uVar23 = uVar23 + 1) {
            if ((local_25c & uVar23) == 0) {
              local_280 = (ulong)uVar23;
              if (((tiling == VK_IMAGE_TILING_LINEAR) ||
                  (bVar9 = ::vk::isCompressedFormat(format), 7 < uVar21 && bVar9)) ||
                 (bVar9 = ::vk::isCompressedFormat(format),
                 (imageType & ~VK_IMAGE_TYPE_3D) == VK_IMAGE_TYPE_1D && bVar9)) {
LAB_004a20ce:
                bVar9 = false;
              }
              else {
                bVar9 = true;
                if ((local_280 & 2) != 0) {
                  bVar9 = ::vk::isCompressedFormat(format);
                  if ((!bVar9) && (bVar9 = ::vk::isDepthStencilFormat(format), !bVar9)) {
                    local_1c8.m_log = (TestLog *)::vk::mapVkFormat(format);
                    uVar23 = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_1c8);
                    if ((uVar23 & uVar23 - 1) == 0) {
                      if (imageType == VK_IMAGE_TYPE_3D) {
                        VVar2 = local_278->sparseResidencyImage3D;
                      }
                      else {
                        if (imageType != VK_IMAGE_TYPE_2D) goto LAB_004a20ce;
                        VVar2 = local_278->sparseResidencyImage2D;
                      }
                      bVar9 = VVar2 == 1;
                      goto LAB_004a20d6;
                    }
                  }
                  goto LAB_004a20ce;
                }
              }
LAB_004a20d6:
              local_1c8.m_log = local_270;
              poVar1 = &local_1c8.m_str;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
              std::operator<<((ostream *)poVar1,"Testing ");
              local_1d8.m_getName = ::vk::getImageTypeName;
              local_1d8.m_value = imageType;
              tcu::Format::Enum<vk::VkImageType,_4UL>::toStream(&local_1d8,(ostream *)poVar1);
              std::operator<<((ostream *)poVar1,", ");
              local_1e8.m_getName = ::vk::getImageTilingName;
              local_1e8.m_value = tiling;
              tcu::Format::Enum<vk::VkImageTiling,_4UL>::toStream(&local_1e8,(ostream *)poVar1);
              std::operator<<((ostream *)poVar1,", ");
              ::vk::getImageUsageFlagsStr((Bitfield<32UL> *)local_2a8,uVar21);
              pMVar17 = tcu::MessageBuilder::operator<<(&local_1c8,(Bitfield<32UL> *)local_2a8);
              std::operator<<((ostream *)&pMVar17->m_str,", ");
              ::vk::getImageCreateFlagsStr(&local_48,(VkImageCreateFlags)local_280);
              pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_48);
              tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8.m_str);
              properties.maxExtent.width = 0xcdcdcdcd;
              properties.maxExtent.height = 0xcdcdcdcd;
              properties.maxExtent.depth = 0xcdcdcdcd;
              properties.maxMipLevels = 0xcdcdcdcd;
              properties.maxArrayLayers = 0xcdcdcdcd;
              properties.sampleCounts = 0xcdcdcdcd;
              properties.maxResourceSize = 0xcdcdcdcdcdcdcdcd;
              pIVar14 = Context::getInstanceInterface(context);
              pVVar15 = Context::getPhysicalDevice(context);
              queryResult = (*pIVar14->_vptr_InstanceInterface[4])
                                      (pIVar14,pVVar15,(ulong)format,(ulong)imageType,(ulong)tiling,
                                       (ulong)uVar21,local_280,&properties);
              if (queryResult == VK_ERROR_FORMAT_NOT_SUPPORTED) {
                local_1c8.m_log = local_270;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8.m_str);
                std::operator<<((ostream *)&local_1c8.m_str,"Got VK_ERROR_FORMAT_NOT_SUPPORTED");
                tcu::MessageBuilder::operator<<
                          (&local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8.m_str);
                if (bVar9) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c8,
                             "VK_ERROR_FORMAT_NOT_SUPPORTED returned for required image parameter combination"
                             ,(allocator<char> *)local_2a8);
                  tcu::ResultCollector::fail(&results,(string *)&local_1c8);
                  std::__cxx11::string::~string((string *)&local_1c8);
                }
                dVar5 = properties.maxExtent.width;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c8,"maxExtent.width != 0",(allocator<char> *)local_2a8)
                ;
                tcu::ResultCollector::check(&results,dVar5 == 0,(string *)&local_1c8);
                std::__cxx11::string::~string((string *)&local_1c8);
                dVar5 = properties.maxExtent.height;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c8,"maxExtent.height != 0",(allocator<char> *)local_2a8
                          );
                tcu::ResultCollector::check(&results,dVar5 == 0,(string *)&local_1c8);
                std::__cxx11::string::~string((string *)&local_1c8);
                dVar5 = properties.maxExtent.depth;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c8,"maxExtent.depth != 0",(allocator<char> *)local_2a8)
                ;
                tcu::ResultCollector::check(&results,dVar5 == 0,(string *)&local_1c8);
                std::__cxx11::string::~string((string *)&local_1c8);
                dVar5 = properties.maxMipLevels;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c8,"maxMipLevels != 0",(allocator<char> *)local_2a8);
                tcu::ResultCollector::check(&results,dVar5 == 0,(string *)&local_1c8);
                std::__cxx11::string::~string((string *)&local_1c8);
                dVar5 = properties.maxArrayLayers;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c8,"maxArrayLayers != 0",(allocator<char> *)local_2a8);
                tcu::ResultCollector::check(&results,dVar5 == 0,(string *)&local_1c8);
                std::__cxx11::string::~string((string *)&local_1c8);
                VVar6 = properties.sampleCounts;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c8,"sampleCounts != 0",(allocator<char> *)local_2a8);
                tcu::ResultCollector::check(&results,VVar6 == 0,(string *)&local_1c8);
                std::__cxx11::string::~string((string *)&local_1c8);
                VVar7 = properties.maxResourceSize;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c8,"maxResourceSize != 0",(allocator<char> *)local_2a8)
                ;
                tcu::ResultCollector::check(&results,VVar7 == 0,(string *)&local_1c8);
LAB_004a2baa:
                pMVar17 = &local_1c8;
              }
              else {
                if (queryResult == VK_SUCCESS) {
                  uVar23 = 0x20;
                  if (properties.maxExtent.width != 0) {
                    uVar23 = 0x1f;
                    if (properties.maxExtent.width != 0) {
                      for (; properties.maxExtent.width >> uVar23 == 0; uVar23 = uVar23 - 1) {
                      }
                    }
                    uVar23 = uVar23 ^ 0x1f;
                  }
                  uVar19 = 0x20;
                  if (properties.maxExtent.height != 0) {
                    uVar19 = 0x1f;
                    if (properties.maxExtent.height != 0) {
                      for (; properties.maxExtent.height >> uVar19 == 0; uVar19 = uVar19 - 1) {
                      }
                    }
                    uVar19 = uVar19 ^ 0x1f;
                  }
                  iVar20 = 0x1f - ((uVar23 - 1) +
                                  (uint)((properties.maxExtent.width - 1 &
                                         properties.maxExtent.width) == 0));
                  iVar10 = 0x1f - ((uVar19 - 1) +
                                  (uint)((properties.maxExtent.height - 1 &
                                         properties.maxExtent.height) == 0));
                  if (iVar10 < iVar20) {
                    iVar10 = iVar20;
                  }
                  uVar23 = 0x20;
                  if (properties.maxExtent.depth != 0) {
                    uVar23 = 0x1f;
                    if (properties.maxExtent.depth != 0) {
                      for (; properties.maxExtent.depth >> uVar23 == 0; uVar23 = uVar23 - 1) {
                      }
                    }
                    uVar23 = uVar23 ^ 0x1f;
                  }
                  iVar20 = 0x1f - ((uVar23 - 1) +
                                  (uint)((properties.maxExtent.depth - 1 &
                                         properties.maxExtent.depth) == 0));
                  if (iVar20 < iVar10) {
                    iVar20 = iVar10;
                  }
                  local_1c8.m_log = local_270;
                  poVar1 = &local_1c8.m_str;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
                  ::vk::operator<<((ostream *)poVar1,&properties);
                  std::operator<<((ostream *)poVar1,"\n");
                  tcu::MessageBuilder::operator<<
                            (&local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
                  bVar24 = true;
                  if (imageType == VK_IMAGE_TYPE_1D) {
                    bVar24 = false;
                    if ((properties.maxExtent.width != 0) &&
                       (bVar24 = false, properties.maxExtent.height == 1)) {
                      bVar24 = properties.maxExtent.depth == 1;
                    }
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c8,"Invalid dimensions for 1D image",
                             (allocator<char> *)local_2a8);
                  tcu::ResultCollector::check(&results,bVar24,(string *)&local_1c8);
                  std::__cxx11::string::~string((string *)&local_1c8);
                  bVar24 = true;
                  if (imageType == VK_IMAGE_TYPE_2D) {
                    bVar24 = false;
                    if ((properties.maxExtent.width != 0) &&
                       (bVar24 = false, properties.maxExtent.height != 0)) {
                      bVar24 = properties.maxExtent.depth == 1;
                    }
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c8,"Invalid dimensions for 2D image",
                             (allocator<char> *)local_2a8);
                  tcu::ResultCollector::check(&results,bVar24,(string *)&local_1c8);
                  std::__cxx11::string::~string((string *)&local_1c8);
                  bVar24 = true;
                  if (imageType == VK_IMAGE_TYPE_3D) {
                    bVar24 = false;
                    if ((properties.maxExtent.width != 0) &&
                       (bVar24 = false, properties.maxExtent.height != 0)) {
                      bVar24 = properties.maxExtent.depth != 0;
                    }
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c8,"Invalid dimensions for 3D image",
                             (allocator<char> *)local_2a8);
                  tcu::ResultCollector::check(&results,bVar24,(string *)&local_1c8);
                  std::__cxx11::string::~string((string *)&local_1c8);
                  dVar5 = properties.maxArrayLayers;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c8,"Invalid maxArrayLayers for 3D image",
                             (allocator<char> *)local_2a8);
                  tcu::ResultCollector::check
                            (&results,dVar5 == 1 || imageType != VK_IMAGE_TYPE_3D,
                             (string *)&local_1c8);
                  std::__cxx11::string::~string((string *)&local_1c8);
                  VVar6 = properties.sampleCounts;
                  if (tiling == VK_IMAGE_TILING_OPTIMAL) {
                    if (((local_280 & 0x10) == 0 && imageType == VK_IMAGE_TYPE_2D) &&
                       (((uVar22 & 0x280) != 0 ||
                        (((uVar22 & 2) != 0 && (local_278->shaderStorageImageMultisample != 0))))))
                    {
                      bVar24 = ::vk::isCompressedFormat(format);
                      uVar8 = local_2a8._32_8_;
                      uVar23 = 1;
                      if (!bVar24) {
                        TVar18 = ::vk::mapVkFormat(format);
                        CVar4 = TVar18.order;
                        uVar23 = CVar4 - CHANNELORDER_LAST;
                        uVar19 = -(uint)((uVar21 & 8) == 0) |
                                 ((VkPhysicalDeviceLimits *)(uVar8 + 0x128))->
                                 storageImageSampleCounts;
                        if ((uVar21 & 4) != 0) {
                          if ((CVar4 == DS) || (CVar4 == D)) {
                            uVar11 = 0xffffffff;
                            if (0xfffffffd < uVar23) {
                              uVar11 = ((VkPhysicalDeviceLimits *)(uVar8 + 0x128))->
                                       sampledImageStencilSampleCounts;
                            }
                            uVar11 = uVar11 & ((VkPhysicalDeviceLimits *)(uVar8 + 0x128))->
                                              sampledImageDepthSampleCounts;
                          }
                          else {
                            uVar11 = 0xffffffff;
                            if (0xfffffffd < uVar23) {
                              uVar11 = ((VkPhysicalDeviceLimits *)(uVar8 + 0x128))->
                                       sampledImageStencilSampleCounts;
                            }
                            if (uVar23 < 0xfffffffd) {
                              TVar12 = tcu::getTextureChannelClass(TVar18.type);
                              uVar19 = uVar19 & (uint)((VkPhysicalDeviceLimits *)(uVar8 + 0x128))->
                                                      pointSizeRange
                                                      [(ulong)((TVar12 & ~
                                                  TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ==
                                                  TEXTURECHANNELCLASS_SIGNED_INTEGER) - 0xc];
                              goto LAB_004a296f;
                            }
                          }
                          uVar19 = uVar19 & uVar11;
                        }
LAB_004a296f:
                        uVar19 = (-(uint)((uVar21 & 0x10) == 0) |
                                 ((VkPhysicalDeviceLimits *)(uVar8 + 0x128))->
                                 framebufferColorSampleCounts) & uVar19;
                        if ((uVar21 & 0x20) != 0) {
                          if ((CVar4 == DS) || (CVar4 == D)) {
                            uVar19 = uVar19 & ((VkPhysicalDeviceLimits *)(uVar8 + 0x128))->
                                              framebufferDepthSampleCounts;
                          }
                          if (0xfffffffd < uVar23) {
                            uVar19 = uVar19 & ((VkPhysicalDeviceLimits *)(uVar8 + 0x128))->
                                              framebufferStencilSampleCounts;
                          }
                        }
                        uVar23 = 1;
                        if (uVar19 != 0xffffffff) {
                          uVar23 = uVar19;
                        }
                      }
                      VVar6 = properties.sampleCounts;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1c8,"Required sample counts not supported",
                                 (allocator<char> *)local_2a8);
                      tcu::ResultCollector::check
                                (&results,(uVar23 & ~VVar6) == 0,(string *)&local_1c8);
                      std::__cxx11::string::~string((string *)&local_1c8);
                    }
                    else if (properties.sampleCounts != 1) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1c8,
                                 "Implementation supports more sample counts than allowed by the spec"
                                 ,(allocator<char> *)local_2a8);
                      tcu::ResultCollector::addResult
                                (&results,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)&local_1c8)
                      ;
                      goto LAB_004a249c;
                    }
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1c8,"sampleCounts != VK_SAMPLE_COUNT_1_BIT",
                               (allocator<char> *)local_2a8);
                    tcu::ResultCollector::check(&results,VVar6 == 1,(string *)&local_1c8);
LAB_004a249c:
                    std::__cxx11::string::~string((string *)&local_1c8);
                  }
                  if (bVar9) {
                    dVar5 = properties.maxExtent.width;
                    uVar23 = ((VkPhysicalDeviceLimits *)(local_2a8._32_8_ + 0x128))->
                             maxImageDimension1D;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1c8,"Reported dimensions smaller than device limits"
                               ,(allocator<char> *)local_2a8);
                    tcu::ResultCollector::check
                              (&results,uVar23 <= dVar5 || imageType != VK_IMAGE_TYPE_1D,
                               (string *)&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                    bVar9 = true;
                    if (imageType == VK_IMAGE_TYPE_2D) {
                      uVar23 = ((VkPhysicalDeviceLimits *)(local_2a8._32_8_ + 0x128))->
                               maxImageDimension2D;
                      if (properties.maxExtent.width < uVar23) {
                        bVar9 = false;
                      }
                      else {
                        bVar9 = uVar23 <= properties.maxExtent.height;
                      }
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1c8,"Reported dimensions smaller than device limits"
                               ,(allocator<char> *)local_2a8);
                    tcu::ResultCollector::check(&results,bVar9,(string *)&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                    bVar9 = true;
                    if (imageType == VK_IMAGE_TYPE_3D) {
                      uVar23 = ((VkPhysicalDeviceLimits *)(local_2a8._32_8_ + 0x128))->
                               maxImageDimension3D;
                      bVar9 = false;
                      if ((uVar23 <= properties.maxExtent.width) &&
                         (bVar9 = false, uVar23 <= properties.maxExtent.height)) {
                        bVar9 = uVar23 <= properties.maxExtent.depth;
                      }
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1c8,"Reported dimensions smaller than device limits"
                               ,(allocator<char> *)local_2a8);
                    tcu::ResultCollector::check(&results,bVar9,(string *)&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                    dVar5 = properties.maxMipLevels;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1c8,"maxMipLevels is not full mip pyramid size",
                               (allocator<char> *)local_2a8);
                    tcu::ResultCollector::check(&results,dVar5 == iVar20 + 1U,(string *)&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                    dVar5 = properties.maxArrayLayers;
                    uVar23 = ((VkPhysicalDeviceLimits *)(local_2a8._32_8_ + 0x128))->
                             maxImageArrayLayers;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1c8,"maxArrayLayers smaller than device limits",
                               (allocator<char> *)local_2a8);
                    tcu::ResultCollector::check
                              (&results,uVar23 <= dVar5 || imageType == VK_IMAGE_TYPE_3D,
                               (string *)&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                  }
                  else {
                    dVar5 = properties.maxMipLevels;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1c8,"Invalid mip pyramid size",
                               (allocator<char> *)local_2a8);
                    tcu::ResultCollector::check
                              (&results,dVar5 == iVar20 + 1U || dVar5 == 1,(string *)&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                    dVar5 = properties.maxArrayLayers;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1c8,"Invalid maxArrayLayers",
                               (allocator<char> *)local_2a8);
                    tcu::ResultCollector::check(&results,dVar5 != 0,(string *)&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                  }
                  VVar7 = properties.maxResourceSize;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c8,
                             "maxResourceSize smaller than minimum required size",
                             (allocator<char> *)local_2a8);
                  tcu::ResultCollector::check(&results,0x7fffffff < VVar7,(string *)&local_1c8);
                  goto LAB_004a2baa;
                }
                de::toString<vk::VkResult>((string *)local_2a8,&queryResult);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_1c8,"Got unexpected error",(string *)local_2a8);
                tcu::ResultCollector::fail(&results,(string *)&local_1c8);
                std::__cxx11::string::~string((string *)&local_1c8);
                pMVar17 = (MessageBuilder *)local_2a8;
              }
              std::__cxx11::string::~string((string *)pMVar17);
              uVar23 = (uint)local_280;
            }
          }
        }
      }
      else if ((uVar21 & 0x30) != 0 && (uVar21 & 0x7fffff0f) == 0) goto LAB_004a201f;
    }
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus imageFormatProperties (Context& context, const VkFormat format, const VkImageType imageType, const VkImageTiling tiling)
{
	TestLog&						log					= context.getTestContext().getLog();
	const VkPhysicalDeviceFeatures&	deviceFeatures		= context.getDeviceFeatures();
	const VkPhysicalDeviceLimits&	deviceLimits		= context.getDeviceProperties().limits;
	const VkFormatProperties		formatProperties	= getPhysicalDeviceFormatProperties(context.getInstanceInterface(), context.getPhysicalDevice(), format);
	const bool						hasKhrMaintenance1	= isExtensionSupported(context.getDeviceExtensions(), "VK_KHR_maintenance1");

	const VkFormatFeatureFlags		supportedFeatures	= tiling == VK_IMAGE_TILING_LINEAR ? formatProperties.linearTilingFeatures : formatProperties.optimalTilingFeatures;
	const VkImageUsageFlags			usageFlagSet		= getValidImageUsageFlags(supportedFeatures, hasKhrMaintenance1);

	tcu::ResultCollector			results				(log, "ERROR: ");

	if (hasKhrMaintenance1 && (supportedFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT) != 0)
	{
		results.check((supportedFeatures & (VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR | VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR)) != 0,
					  "A sampled image format must have VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR and VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR format feature flags set");
	}

	for (VkImageUsageFlags curUsageFlags = 0; curUsageFlags <= usageFlagSet; curUsageFlags++)
	{
		if ((curUsageFlags & ~usageFlagSet) != 0 ||
			!isValidImageUsageFlagCombination(curUsageFlags))
			continue;

		const VkImageCreateFlags	createFlagSet		= getValidImageCreateFlags(deviceFeatures, format, supportedFeatures, imageType, curUsageFlags);

		for (VkImageCreateFlags curCreateFlags = 0; curCreateFlags <= createFlagSet; curCreateFlags++)
		{
			if ((curCreateFlags & ~createFlagSet) != 0 ||
				!isValidImageCreateFlagCombination(curCreateFlags))
				continue;

			const bool				isRequiredCombination	= isRequiredImageParameterCombination(deviceFeatures,
																								  format,
																								  formatProperties,
																								  imageType,
																								  tiling,
																								  curUsageFlags,
																								  curCreateFlags);
			VkImageFormatProperties	properties;
			VkResult				queryResult;

			log << TestLog::Message << "Testing " << getImageTypeStr(imageType) << ", "
									<< getImageTilingStr(tiling) << ", "
									<< getImageUsageFlagsStr(curUsageFlags) << ", "
									<< getImageCreateFlagsStr(curCreateFlags)
				<< TestLog::EndMessage;

			// Set return value to known garbage
			deMemset(&properties, 0xcd, sizeof(properties));

			queryResult = context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(context.getPhysicalDevice(),
																								format,
																								imageType,
																								tiling,
																								curUsageFlags,
																								curCreateFlags,
																								&properties);

			if (queryResult == VK_SUCCESS)
			{
				const deUint32	fullMipPyramidSize	= de::max(de::max(deLog2Ceil32(properties.maxExtent.width),
																	  deLog2Ceil32(properties.maxExtent.height)),
															  deLog2Ceil32(properties.maxExtent.depth)) + 1;

				log << TestLog::Message << properties << "\n" << TestLog::EndMessage;

				results.check(imageType != VK_IMAGE_TYPE_1D || (properties.maxExtent.width >= 1 && properties.maxExtent.height == 1 && properties.maxExtent.depth == 1), "Invalid dimensions for 1D image");
				results.check(imageType != VK_IMAGE_TYPE_2D || (properties.maxExtent.width >= 1 && properties.maxExtent.height >= 1 && properties.maxExtent.depth == 1), "Invalid dimensions for 2D image");
				results.check(imageType != VK_IMAGE_TYPE_3D || (properties.maxExtent.width >= 1 && properties.maxExtent.height >= 1 && properties.maxExtent.depth >= 1), "Invalid dimensions for 3D image");
				results.check(imageType != VK_IMAGE_TYPE_3D || properties.maxArrayLayers == 1, "Invalid maxArrayLayers for 3D image");

				if (tiling == VK_IMAGE_TILING_OPTIMAL)
				{
					// Vulkan API specification has changed since initial Android Nougat release.
					// For NYC CTS we need to tolerate old behavior as well and issue compatibility
					// warning instead.
					//
					// See spec issues 272, 282, 302, 445 and CTS issues 369, 440.
					const bool	requiredByNewSpec	= (imageType == VK_IMAGE_TYPE_2D && !(curCreateFlags & VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT) &&
													  ((supportedFeatures & (VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT | VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT)) ||
													  ((supportedFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT) && deviceFeatures.shaderStorageImageMultisample)));

					if (requiredByNewSpec)
					{
						const VkSampleCountFlags	requiredSampleCounts	= getRequiredOptimalTilingSampleCounts(deviceLimits, format, curUsageFlags);

						results.check((properties.sampleCounts & requiredSampleCounts) == requiredSampleCounts, "Required sample counts not supported");
					}
					else if (properties.sampleCounts != VK_SAMPLE_COUNT_1_BIT)
					{
						results.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING,
									      "Implementation supports more sample counts than allowed by the spec");
					}
				}
				else
					results.check(properties.sampleCounts == VK_SAMPLE_COUNT_1_BIT, "sampleCounts != VK_SAMPLE_COUNT_1_BIT");

				if (isRequiredCombination)
				{
					results.check(imageType != VK_IMAGE_TYPE_1D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension1D),
								  "Reported dimensions smaller than device limits");
					results.check(imageType != VK_IMAGE_TYPE_2D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension2D &&
																	properties.maxExtent.height	>= deviceLimits.maxImageDimension2D),
								  "Reported dimensions smaller than device limits");
					results.check(imageType != VK_IMAGE_TYPE_3D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension3D &&
																	properties.maxExtent.height	>= deviceLimits.maxImageDimension3D &&
																	properties.maxExtent.depth	>= deviceLimits.maxImageDimension3D),
								  "Reported dimensions smaller than device limits");
					results.check(properties.maxMipLevels == fullMipPyramidSize, "maxMipLevels is not full mip pyramid size");
					results.check(imageType == VK_IMAGE_TYPE_3D || properties.maxArrayLayers >= deviceLimits.maxImageArrayLayers,
								  "maxArrayLayers smaller than device limits");
				}
				else
				{
					results.check(properties.maxMipLevels == 1 || properties.maxMipLevels == fullMipPyramidSize, "Invalid mip pyramid size");
					results.check(properties.maxArrayLayers >= 1, "Invalid maxArrayLayers");
				}

				results.check(properties.maxResourceSize >= (VkDeviceSize)MINIMUM_REQUIRED_IMAGE_RESOURCE_SIZE,
							  "maxResourceSize smaller than minimum required size");
			}
			else if (queryResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
			{
				log << TestLog::Message << "Got VK_ERROR_FORMAT_NOT_SUPPORTED" << TestLog::EndMessage;

				if (isRequiredCombination)
					results.fail("VK_ERROR_FORMAT_NOT_SUPPORTED returned for required image parameter combination");

				// Specification requires that all fields are set to 0
				results.check(properties.maxExtent.width	== 0, "maxExtent.width != 0");
				results.check(properties.maxExtent.height	== 0, "maxExtent.height != 0");
				results.check(properties.maxExtent.depth	== 0, "maxExtent.depth != 0");
				results.check(properties.maxMipLevels		== 0, "maxMipLevels != 0");
				results.check(properties.maxArrayLayers		== 0, "maxArrayLayers != 0");
				results.check(properties.sampleCounts		== 0, "sampleCounts != 0");
				results.check(properties.maxResourceSize	== 0, "maxResourceSize != 0");
			}
			else
			{
				results.fail("Got unexpected error" + de::toString(queryResult));
			}
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}